

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

MatrixXd * __thiscall
lf::uscalfe::FeLagrangeO3Quad<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeLagrangeO3Quad<double> *this)

{
  DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *this_00;
  DenseBase<Eigen::Matrix<double,_2,_8,_0,_2,_8>_> *this_01;
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<double,_2,_16,_0,_2,_16>_> *this_02;
  CommaInitializer<Eigen::Matrix<double,_2,_16,_0,_2,_16>_> local_3b8;
  Scalar local_398;
  Scalar local_390;
  Scalar local_388;
  Scalar local_380;
  Scalar local_378;
  Scalar local_370;
  Scalar local_368;
  Scalar local_360;
  Scalar local_358;
  Scalar local_350;
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> local_348;
  Scalar local_328;
  Scalar local_320;
  Scalar local_318;
  Scalar local_310;
  Scalar local_308;
  Scalar local_300;
  Scalar local_2f8;
  Scalar local_2f0;
  Scalar local_2e8;
  Scalar local_2e0;
  Scalar local_2d8;
  Scalar local_2d0;
  Scalar local_2c8;
  Scalar local_2c0;
  Scalar local_2b8;
  Scalar local_2b0;
  CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_> local_2a8;
  Scalar local_288;
  Scalar local_280;
  Scalar local_278;
  Scalar local_270;
  Scalar local_268;
  Scalar local_260 [3];
  Scalar local_248;
  Scalar local_240;
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> local_238;
  undefined1 local_218 [8];
  Matrix<double,_2,_4,_0,_2,_4> interior;
  Matrix<double,_2,_8,_0,_2,_8> midpoints;
  Matrix<double,_2,_4,_0,_2,_4> vertices;
  Matrix<double,_2,_16,_0,_2,_16> nodes;
  FeLagrangeO3Quad<double> *this_local;
  
  Eigen::Matrix<double,_2,_16,_0,_2,_16>::Matrix
            ((Matrix<double,_2,_16,_0,_2,_16> *)
             (vertices.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data
              .array + 7));
  this_00 = (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)
            (midpoints.super_PlainObjectBase<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>.m_storage.m_data
             .array + 0xf);
  Eigen::Matrix<double,_2,_4,_0,_2,_4>::Matrix((Matrix<double,_2,_4,_0,_2,_4> *)this_00);
  Eigen::Matrix<double,_2,_8,_0,_2,_8>::Matrix
            ((Matrix<double,_2,_8,_0,_2,_8> *)
             (interior.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data
              .array + 7));
  Eigen::Matrix<double,_2,_4,_0,_2,_4>::Matrix((Matrix<double,_2,_4,_0,_2,_4> *)local_218);
  local_240 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator<<(&local_238,this_00,&local_240)
  ;
  local_248 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (&local_238,&local_248);
  local_260[0] = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar1,local_260);
  local_268 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar1,&local_268);
  local_270 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar1,&local_270);
  local_278 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar1,&local_278);
  local_280 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar1,&local_280);
  local_288 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_(pCVar1,&local_288);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::~CommaInitializer(&local_238);
  local_2b0 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator<<
            (&local_2a8,
             (DenseBase<Eigen::Matrix<double,_2,_8,_0,_2,_8>_> *)
             (interior.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data
              .array + 7),&local_2b0);
  local_2b8 = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (&local_2a8,&local_2b8);
  local_2c0 = 3.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_2c0);
  local_2c8 = 3.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_2c8);
  local_2d0 = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_2d0);
  local_2d8 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_2d8);
  local_2e0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_2e0);
  local_2e8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_2e8);
  local_2f0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_2f0);
  local_2f8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_2f8);
  local_300 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_300);
  local_308 = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_308);
  local_310 = 3.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_310);
  local_318 = 3.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_318);
  local_320 = 2.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_
                     (pCVar2,&local_320);
  local_328 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator_(pCVar2,&local_328);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::~CommaInitializer(&local_2a8);
  local_350 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator<<
            (&local_348,(DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_218,&local_350);
  local_358 = 2.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (&local_348,&local_358);
  local_360 = 2.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar1,&local_360);
  local_368 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar1,&local_368);
  local_370 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar1,&local_370);
  local_378 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar1,&local_378);
  local_380 = 2.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_
                     (pCVar1,&local_380);
  local_388 = 2.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator_(pCVar1,&local_388);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::~CommaInitializer(&local_348);
  local_390 = 0.3333333333333333;
  this_01 = (DenseBase<Eigen::Matrix<double,_2,_8,_0,_2,_8>_> *)
            (interior.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data.
             array + 7);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>::operator*=(this_01,&local_390);
  local_398 = 0.3333333333333333;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_218,&local_398);
  Eigen::DenseBase<Eigen::Matrix<double,2,16,0,2,16>>::operator<<
            (&local_3b8,
             (DenseBase<Eigen::Matrix<double,2,16,0,2,16>> *)
             (vertices.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data
              .array + 7),
             (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)
             (midpoints.super_PlainObjectBase<Eigen::Matrix<double,_2,_8,_0,_2,_8>_>.m_storage.
              m_data.array + 0xf));
  this_02 = Eigen::CommaInitializer<Eigen::Matrix<double,2,16,0,2,16>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,2,16,0,2,16>> *)&local_3b8,this_01);
  Eigen::CommaInitializer<Eigen::Matrix<double,2,16,0,2,16>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,16,0,2,16>> *)this_02,
             (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)local_218);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_16,_0,_2,_16>_>::~CommaInitializer(&local_3b8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,16,0,2,16>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::Matrix<double,_2,_16,_0,_2,_16>_> *)
             (vertices.super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>.m_storage.m_data
              .array + 7));
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    Eigen::Matrix<double, 2, 16> nodes;

    Eigen::Matrix<double, 2, 4> vertices;
    Eigen::Matrix<double, 2, 8> midpoints;
    Eigen::Matrix<double, 2, 4> interior;

    // clang-format off
    vertices << 0.0, 1.0, 1.0, 0.0,
                0.0, 0.0, 1.0, 1.0;
    midpoints << 1.0, 2.0, 3.0, 3.0, 2.0, 1.0, 0.0, 0.0,
                 0.0, 0.0, 1.0, 2.0, 3.0, 3.0, 2.0, 1.0;
    interior << 1.0, 2.0, 2.0, 1.0,
                1.0, 1.0, 2.0, 2.0;
    // clang-format on
    midpoints *= 1.0 / 3.0;
    interior *= 1.0 / 3.0;

    nodes << vertices, midpoints, interior;

    return nodes;
  }